

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin>::operator()
          (StairsRenderer<ImPlot::GetterFuncPtr,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  ImPlotContext *pIVar11;
  bool bVar12;
  double dVar13;
  ImVec2 IVar14;
  ImPlotPoint IVar18;
  float fVar15;
  double in_XMM1_Qa;
  float fVar16;
  float fVar17;
  
  pTVar7 = this->Transformer;
  IVar18.x = (*this->Getter->Getter)(this->Getter->Data,prim + 1);
  pIVar11 = GImPlot;
  dVar13 = log10((double)IVar18.x / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar11->CurrentPlot;
  dVar3 = (pIVar8->XAxis).Range.Min;
  iVar5 = pTVar7->YAxis;
  IVar14.x = (float)((((double)(float)(dVar13 / pIVar11->LogDenX) *
                       ((pIVar8->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar11->Mx +
                    (double)pIVar11->PixelRange[iVar5].Min.x);
  fVar15 = (float)((in_XMM1_Qa - pIVar8->YAxis[iVar5].Range.Min) * pIVar11->My[iVar5] +
                  (double)pIVar11->PixelRange[iVar5].Min.y);
  fVar2 = (this->P1).x;
  fVar16 = (this->P1).y;
  fVar17 = fVar16;
  if (fVar15 <= fVar16) {
    fVar17 = fVar15;
  }
  bVar12 = false;
  if ((fVar17 < (cull_rect->Max).y) &&
     (fVar16 = (float)(-(uint)(fVar15 <= fVar16) & (uint)fVar16 |
                      ~-(uint)(fVar15 <= fVar16) & (uint)fVar15), pfVar1 = &(cull_rect->Min).y,
     bVar12 = false, *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
    fVar16 = fVar2;
    if (IVar14.x <= fVar2) {
      fVar16 = IVar14.x;
    }
    if (fVar16 < (cull_rect->Max).x) {
      fVar16 = (float)(~-(uint)(IVar14.x <= fVar2) & (uint)IVar14.x |
                      -(uint)(IVar14.x <= fVar2) & (uint)fVar2);
      bVar12 = (cull_rect->Min).x <= fVar16 && fVar16 != (cull_rect->Min).x;
    }
  }
  if (bVar12 != false) {
    fVar16 = (this->P1).y;
    fVar17 = fVar16 + this->HalfWeight;
    fVar16 = fVar16 - this->HalfWeight;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    (pIVar9->pos).x = fVar2;
    (pIVar9->pos).y = fVar17;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar6;
    pIVar9[1].pos.x = IVar14.x;
    pIVar9[1].pos.y = fVar16;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar6;
    pIVar9[2].pos.x = fVar2;
    pIVar9[2].pos.y = fVar16;
    pIVar9[2].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar6;
    pIVar9[3].pos.x = IVar14.x;
    pIVar9[3].pos.y = fVar17;
    pIVar9[3].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = DrawList->_VtxCurrentIdx;
    puVar10[1] = DrawList->_VtxCurrentIdx + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    puVar10[3] = DrawList->_VtxCurrentIdx;
    puVar10[4] = DrawList->_VtxCurrentIdx + 1;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar17 = IVar14.x - this->HalfWeight;
    fVar16 = this->HalfWeight + IVar14.x;
    fVar2 = (this->P1).y;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar9[4].pos.x = fVar17;
    pIVar9[4].pos.y = fVar15;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar6;
    pIVar9[1].pos.x = fVar16;
    pIVar9[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar6;
    pIVar9[2].pos.x = fVar17;
    pIVar9[2].pos.y = fVar2;
    pIVar9[2].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar6;
    pIVar9[3].pos.x = fVar16;
    pIVar9[3].pos.y = fVar15;
    pIVar9[3].uv = IVar4;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = DrawList->_VtxCurrentIdx;
    puVar10[1] = DrawList->_VtxCurrentIdx + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    puVar10[3] = DrawList->_VtxCurrentIdx;
    puVar10[4] = DrawList->_VtxCurrentIdx + 1;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar14.y = fVar15;
  this->P1 = IVar14;
  return bVar12;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }